

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_cell_query_base.h
# Opt level: O2

void __thiscall
S2ClosestCellQueryBase<S2MinDistance>::AddRange
          (S2ClosestCellQueryBase<S2MinDistance> *this,RangeIterator *range)

{
  ContentsIterator *this_00;
  Label label;
  S2CellId cell_id;
  
  this_00 = &this->contents_it_;
  S2CellIndex::ContentsIterator::StartUnion(this_00,range);
  while ((this->contents_it_).node_.label != -1) {
    cell_id = S2CellIndex::ContentsIterator::cell_id(this_00);
    label = S2CellIndex::ContentsIterator::label(this_00);
    MaybeAddResult(this,cell_id,label);
    S2CellIndex::ContentsIterator::Next(this_00);
  }
  return;
}

Assistant:

void S2ClosestCellQueryBase<Distance>::AddRange(const RangeIterator& range) {
  for (contents_it_.StartUnion(range);
       !contents_it_.done(); contents_it_.Next()) {
    MaybeAddResult(contents_it_.cell_id(), contents_it_.label());
  }
}